

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalFindFrame(Wal *pWal,Pgno pgno,u32 *piRead)

{
  int iVar1;
  uint uVar2;
  u32 iFrame;
  int rc;
  int nCollide;
  int iKey;
  u32 iZero;
  u32 *aPgno;
  ht_slot *aHash;
  int iMinHash;
  int iHash;
  u32 iLast;
  u32 iRead;
  u32 *piRead_local;
  Wal *pWStack_18;
  Pgno pgno_local;
  Wal *pWal_local;
  
  iHash = 0;
  iMinHash = (pWal->hdr).mxFrame;
  if ((iMinHash == 0) || (pWal->readLock == 0)) {
    *piRead = 0;
  }
  else {
    _iLast = piRead;
    piRead_local._4_4_ = pgno;
    pWStack_18 = pWal;
    aHash._0_4_ = walFramePage(pWal->minFrame);
    for (aHash._4_4_ = walFramePage(iMinHash); (int)aHash <= aHash._4_4_ && iHash == 0;
        aHash._4_4_ = aHash._4_4_ + -1) {
      iVar1 = walHashGet(pWStack_18,aHash._4_4_,(ht_slot **)&aPgno,(u32 **)&iKey,(u32 *)&nCollide);
      if (iVar1 != 0) {
        return iVar1;
      }
      iFrame = 0x2000;
      rc = walHash(piRead_local._4_4_);
      while (*(short *)((long)aPgno + (long)rc * 2) != 0) {
        uVar2 = (uint)*(ushort *)((long)aPgno + (long)rc * 2) + nCollide;
        if (((uVar2 <= (uint)iMinHash) && (pWStack_18->minFrame <= uVar2)) &&
           (_iKey[*(ushort *)((long)aPgno + (long)rc * 2)] == piRead_local._4_4_)) {
          iHash = uVar2;
        }
        if (iFrame == 0) {
          iVar1 = sqlite3CorruptError(0xe135);
          return iVar1;
        }
        rc = walNextHash(rc);
        iFrame = iFrame - 1;
      }
    }
    *_iLast = iHash;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalFindFrame(
  Wal *pWal,                      /* WAL handle */
  Pgno pgno,                      /* Database page number to read data for */
  u32 *piRead                     /* OUT: Frame number (or zero) */
){
  u32 iRead = 0;                  /* If !=0, WAL frame to return data from */
  u32 iLast = pWal->hdr.mxFrame;  /* Last page in WAL for this reader */
  int iHash;                      /* Used to loop through N hash tables */
  int iMinHash;

  /* This routine is only be called from within a read transaction. */
  assert( pWal->readLock>=0 || pWal->lockError );

  /* If the "last page" field of the wal-index header snapshot is 0, then
  ** no data will be read from the wal under any circumstances. Return early
  ** in this case as an optimization.  Likewise, if pWal->readLock==0, 
  ** then the WAL is ignored by the reader so return early, as if the 
  ** WAL were empty.
  */
  if( iLast==0 || pWal->readLock==0 ){
    *piRead = 0;
    return SQLITE_OK;
  }

  /* Search the hash table or tables for an entry matching page number
  ** pgno. Each iteration of the following for() loop searches one
  ** hash table (each hash table indexes up to HASHTABLE_NPAGE frames).
  **
  ** This code might run concurrently to the code in walIndexAppend()
  ** that adds entries to the wal-index (and possibly to this hash 
  ** table). This means the value just read from the hash 
  ** slot (aHash[iKey]) may have been added before or after the 
  ** current read transaction was opened. Values added after the
  ** read transaction was opened may have been written incorrectly -
  ** i.e. these slots may contain garbage data. However, we assume
  ** that any slots written before the current read transaction was
  ** opened remain unmodified.
  **
  ** For the reasons above, the if(...) condition featured in the inner
  ** loop of the following block is more stringent that would be required 
  ** if we had exclusive access to the hash-table:
  **
  **   (aPgno[iFrame]==pgno): 
  **     This condition filters out normal hash-table collisions.
  **
  **   (iFrame<=iLast): 
  **     This condition filters out entries that were added to the hash
  **     table after the current read-transaction had started.
  */
  iMinHash = walFramePage(pWal->minFrame);
  for(iHash=walFramePage(iLast); iHash>=iMinHash && iRead==0; iHash--){
    volatile ht_slot *aHash;      /* Pointer to hash table */
    volatile u32 *aPgno;          /* Pointer to array of page numbers */
    u32 iZero;                    /* Frame number corresponding to aPgno[0] */
    int iKey;                     /* Hash slot index */
    int nCollide;                 /* Number of hash collisions remaining */
    int rc;                       /* Error code */

    rc = walHashGet(pWal, iHash, &aHash, &aPgno, &iZero);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nCollide = HASHTABLE_NSLOT;
    for(iKey=walHash(pgno); aHash[iKey]; iKey=walNextHash(iKey)){
      u32 iFrame = aHash[iKey] + iZero;
      if( iFrame<=iLast && iFrame>=pWal->minFrame && aPgno[aHash[iKey]]==pgno ){
        assert( iFrame>iRead || CORRUPT_DB );
        iRead = iFrame;
      }
      if( (nCollide--)==0 ){
        return SQLITE_CORRUPT_BKPT;
      }
    }
  }

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
  /* If expensive assert() statements are available, do a linear search
  ** of the wal-index file content. Make sure the results agree with the
  ** result obtained using the hash indexes above.  */
  {
    u32 iRead2 = 0;
    u32 iTest;
    assert( pWal->minFrame>0 );
    for(iTest=iLast; iTest>=pWal->minFrame; iTest--){
      if( walFramePgno(pWal, iTest)==pgno ){
        iRead2 = iTest;
        break;
      }
    }
    assert( iRead==iRead2 );
  }
#endif

  *piRead = iRead;
  return SQLITE_OK;
}